

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O1

void __thiscall
Js::CustomExternalWrapperObject::SetPrototype
          (CustomExternalWrapperObject *this,RecyclableObject *newPrototype)

{
  BOOL BVar1;
  Var aValue;
  RecyclableObject *newPrototype_00;
  
  BVar1 = VerifyObjectAlive(this);
  if (BVar1 != 0) {
    aValue = CrossSite::MarshalVar
                       ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                          javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,
                        newPrototype,false);
    newPrototype_00 = VarTo<Js::RecyclableObject>(aValue);
    DynamicObject::SetPrototype(&this->super_DynamicObject,newPrototype_00);
    return;
  }
  return;
}

Assistant:

void CustomExternalWrapperObject::SetPrototype(RecyclableObject* newPrototype)
{
    if (!this->VerifyObjectAlive())
    {
        return;
    }

    // setting the value could be deferred and now we are on a different context from
    // make sure the value has the same context as the containing object.
    newPrototype = VarTo<RecyclableObject>(Js::CrossSite::MarshalVar(this->GetScriptContext(), newPrototype));
    DynamicObject::SetPrototype(newPrototype);
}